

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

int cpu_memory_rw_debug_arm
              (CPUState *cpu,target_ulong addr,void *ptr,target_ulong len,_Bool is_write)

{
  uint uVar1;
  uc_struct_conflict7 *puVar2;
  _func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *p_Var3;
  AddressSpace *as;
  vaddr vVar4;
  uint uVar5;
  hwaddr hVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  MemTxAttrs attrs;
  
  uVar8 = len & 0xffffffff;
  uVar10 = addr & 0xffffffff;
  puVar2 = cpu->uc;
  while( true ) {
    uVar7 = (uint)uVar8;
    if (uVar7 == 0) {
      return 0;
    }
    uVar11 = (uint)uVar10;
    uVar9 = puVar2->init_target_page->mask & uVar11;
    p_Var3 = cpu->cc->get_phys_page_attrs_debug;
    vVar4 = (vaddr)uVar9;
    if (p_Var3 == (_func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *)0x0) {
      attrs = (MemTxAttrs)0x1;
      hVar6 = (*cpu->cc->get_phys_page_debug)((CPUState_conflict *)cpu,vVar4);
    }
    else {
      hVar6 = (*p_Var3)((CPUState_conflict *)cpu,vVar4,&attrs);
    }
    uVar5 = cpu_asidx_from_attrs(cpu,attrs);
    if (hVar6 == 0xffffffffffffffff) break;
    uVar1 = puVar2->init_target_page->mask;
    uVar9 = (uVar9 - uVar1) - uVar11;
    uVar10 = (ulong)uVar9;
    if (uVar7 <= uVar9) {
      uVar10 = uVar8;
    }
    hVar6 = hVar6 + (~uVar1 & uVar11);
    as = cpu->cpu_ases[uVar5].as;
    if (is_write) {
      address_space_write_rom_arm(as,hVar6,attrs,ptr,uVar10);
    }
    else {
      address_space_read_full_arm(as,hVar6,attrs,ptr,uVar10);
    }
    uVar8 = (ulong)(uVar7 - (int)uVar10);
    ptr = (void *)((long)ptr + uVar10);
    uVar10 = (ulong)(uVar11 + (int)uVar10);
  }
  return -1;
}

Assistant:

int cpu_memory_rw_debug(CPUState *cpu, target_ulong addr,
                        void *ptr, target_ulong len, bool is_write)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    hwaddr phys_addr;
    target_ulong l, page;
    uint8_t *buf = ptr;

    while (len > 0) {
        int asidx;
        MemTxAttrs attrs;

        page = addr & TARGET_PAGE_MASK;
        phys_addr = cpu_get_phys_page_attrs_debug(cpu, page, &attrs);
        asidx = cpu_asidx_from_attrs(cpu, attrs);
        /* if no physical page mapped, return an error */
        if (phys_addr == -1)
            return -1;
        l = (page + TARGET_PAGE_SIZE) - addr;
        if (l > len)
            l = len;
        phys_addr += (addr & ~TARGET_PAGE_MASK);
        if (is_write) {
            address_space_write_rom(cpu->cpu_ases[asidx].as, phys_addr,
                                    attrs, buf, l);
        } else {
            address_space_read(cpu->cpu_ases[asidx].as, phys_addr, attrs, buf,
                               l);
        }
        len -= l;
        buf += l;
        addr += l;
    }
    return 0;
}